

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O1

void mapDraw(vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *obstalces,Obstacle *obst,Mat *src)

{
  pointer pvVar1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *pvVar2;
  undefined8 uVar3;
  ulong uVar4;
  const_iterator __begin1;
  pointer pPVar5;
  pointer pPVar6;
  Point *pt;
  ulong in_stack_ffffffffffffff18;
  undefined4 local_d0 [2];
  Mat *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Obstacle *local_98;
  undefined4 local_90 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_88;
  undefined8 local_80;
  Mat *local_78;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_70;
  ulong local_68;
  Point_<int> local_60;
  Point_<int> local_58;
  Point_<int> local_50;
  Point_<int> local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_98 = obst;
  if ((obstalces->
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (obstalces->
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    local_78 = src;
    local_70 = obstalces;
    do {
      pvVar2 = local_70;
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_80 = 0;
      local_90[0] = 0x8104000c;
      local_b8 = 0x4054000000000000;
      uStack_b0 = 0x4054000000000000;
      local_a8 = 0x4054000000000000;
      uStack_a0 = 0;
      local_c8 = src;
      local_88 = local_70;
      uVar3 = cv::noArray();
      local_38 = 0;
      cv::drawContours(local_d0,local_90,uVar4 & 0xffffffff,&local_b8,0xffffffff,8,uVar3,0x7fffffff,
                       &local_38);
      src = local_78;
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_c8 = local_78;
      local_80 = 0;
      local_90[0] = 0x8104000c;
      local_b8 = 0x406fe00000000000;
      uStack_a0 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      local_88 = pvVar2;
      in_stack_ffffffffffffff18 = cv::noArray();
      local_40 = 0;
      cv::drawContours(local_d0,local_90,uVar4 & 0xffffffff,&local_b8,3,8,in_stack_ffffffffffffff18,
                       0x7fffffff,&local_40);
      pvVar1 = (pvVar2->
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pPVar6 = *(pointer *)
                ((long)&pvVar1[uVar4].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data + 8);
      local_68 = uVar4;
      for (pPVar5 = pvVar1[uVar4].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start; pPVar5 != pPVar6; pPVar5 = pPVar5 + 1) {
        uStack_c0 = 0;
        local_d0[0] = 0x3010000;
        local_c8 = src;
        local_48 = *pPVar5;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 & 0xffffffff00000000;
        cv::circle(local_d0,&local_48,2,&local_b8,0xffffffff,8,in_stack_ffffffffffffff18);
      }
      uVar4 = local_68 + 1;
    } while (uVar4 < (ulong)(((long)(local_70->
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_70->
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  pPVar5 = (local_98->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar6 = (local_98->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)pPVar6 - (long)pPVar5)) {
    uVar4 = 1;
    do {
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_50 = pPVar5[uVar4 - 1];
      local_58 = pPVar5[uVar4];
      local_b8 = 0;
      uStack_b0 = 0x406fe00000000000;
      local_a8 = 0;
      uStack_a0 = 0;
      in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 & 0xffffffff00000000;
      local_c8 = src;
      cv::line(local_d0,&local_50,&local_58,&local_b8,3,8,in_stack_ffffffffffffff18);
      uVar4 = uVar4 + 1;
      pPVar5 = (local_98->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pPVar6 = (local_98->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar4 < (ulong)((long)pPVar6 - (long)pPVar5 >> 3));
  }
  if (pPVar5 != pPVar6) {
    do {
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_60 = *pPVar5;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 & 0xffffffff00000000;
      local_c8 = src;
      cv::circle(local_d0,&local_60,2,&local_b8,0xffffffff,8,in_stack_ffffffffffffff18);
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 != pPVar6);
  }
  return;
}

Assistant:

void mapDraw(const std::vector<Obstacle>& obstalces, const Obstacle& obst, cv::Mat& src) {
    for (size_t i = 0; i <  obstalces.size(); i++) {
        cv::drawContours(src, obstalces, i, cv::Scalar(80, 80, 80), -1);
        cv::drawContours(src, obstalces, i, cv::Scalar(255, 0, 0), 3);
        for (const cv::Point& pt: obstalces[i]) {
            cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
        }
    }
    for (size_t i = 1; i < obst.size(); i++) {
        cv::line(src, obst[i - 1], obst[i], cv::Scalar(0, 255, 0), 3);
    }
    for (const cv::Point& pt: obst) {
        cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
    }
}